

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracing.cc
# Opt level: O0

void __thiscall wabt::TraceScope::~TraceScope(TraceScope *this)

{
  TraceScope *this_local;
  
  anon_unknown.dwarf_216a4f::Dedent();
  fputs("<- ",_stderr);
  fputs(this->method_,_stderr);
  fputc(10,_stderr);
  return;
}

Assistant:

TraceScope::~TraceScope() {
  Dedent();
  fputs("<- ", stderr);
  fputs(method_, stderr);
  fputc('\n', stderr);
}